

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  long lVar1;
  int *in_RDI;
  ImDrawCmd *curr_cmd;
  ImDrawList *in_stack_00000030;
  
  in_RDI[0xd] = 0;
  lVar1 = *(long *)(in_RDI + 2) + (long)(*in_RDI + -1) * 0x38;
  if (*(int *)(lVar1 + 0x20) == 0) {
    if (*(long *)(lVar1 + 0x28) != 0) {
      __assert_fail("curr_cmd->UserCallback == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x21d,"void ImDrawList::_OnChangedVtxOffset()");
    }
    *(int *)(lVar1 + 0x18) = in_RDI[0x28];
  }
  else {
    AddDrawCmd(in_stack_00000030);
  }
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}